

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O1

int find_str(char *a,char *b,int lena,int lenb)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  
  if (lenb <= lena) {
    uVar3 = 0;
    pcVar4 = a;
    do {
      if (lenb < 1) {
        bVar6 = true;
        bVar1 = lenb < 1;
      }
      else {
        bVar6 = a[uVar3] == *b;
        if (bVar6) {
          uVar2 = 1;
          do {
            uVar5 = uVar2;
            if ((uint)lenb == uVar5) {
              bVar6 = true;
              break;
            }
            bVar6 = pcVar4[uVar5] == b[uVar5];
            uVar2 = uVar5 + 1;
          } while (bVar6);
          bVar1 = (uint)lenb <= uVar5;
        }
        else {
          bVar1 = false;
        }
      }
      if ((bVar1) && (bVar6)) {
        return (int)uVar3;
      }
      uVar3 = uVar3 + 1;
      pcVar4 = pcVar4 + 1;
    } while (uVar3 != (lena - lenb) + 1);
  }
  return -1;
}

Assistant:

int find_str(char* a, const char* b,int lena,int lenb) {
	for (int i = 0; i < lena - lenb+1; i++)
	{
		if (bincmp(a + i, b, lenb))
			return i;
	}

	return -1;
}